

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_adaptive_quantize_avx2.c
# Opt level: O0

void highbd_mul_shift_avx2(__m256i *x,__m256i *y,__m256i *p,int shift)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  uint in_ECX;
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  __m256i mult_hi;
  __m256i prod_hi;
  __m256i prod_lo;
  
  auVar1 = vpmuldq_avx2(*in_RDI,*in_RSI);
  auVar2 = vpsrlq_avx2(*in_RDI,ZEXT416(0x20));
  auVar3 = vpsrlq_avx2(*in_RSI,ZEXT416(0x20));
  auVar2 = vpmuldq_avx2(auVar2,auVar3);
  auVar3 = vpsrlq_avx2(auVar1,ZEXT416(in_ECX));
  auVar1 = vpsrlq_avx2(auVar2,ZEXT416(in_ECX));
  auVar1 = vpsllq_avx2(auVar1,ZEXT416(0x20));
  auVar1 = vpblendd_avx2(auVar3,auVar1,0xaa);
  *in_RDX = auVar1;
  return;
}

Assistant:

static inline void highbd_mul_shift_avx2(const __m256i *x, const __m256i *y,
                                         __m256i *p, const int shift) {
  __m256i prod_lo = _mm256_mul_epi32(*x, *y);
  __m256i prod_hi = _mm256_srli_epi64(*x, 32);
  const __m256i mult_hi = _mm256_srli_epi64(*y, 32);
  prod_hi = _mm256_mul_epi32(prod_hi, mult_hi);

  prod_lo = _mm256_srli_epi64(prod_lo, shift);
  prod_hi = _mm256_srli_epi64(prod_hi, shift);

  prod_hi = _mm256_slli_epi64(prod_hi, 32);
  *p = _mm256_blend_epi32(prod_lo, prod_hi, 0xaa);
}